

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

xmlPatternPtr xmlPatterncompile(xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces)

{
  xmlChar xVar1;
  xmlPatOp xVar2;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar3;
  bool bVar4;
  bool bVar5;
  xmlStepOpPtr pxVar6;
  xmlPatternPtr pxVar7;
  _xmlPattern *p_Var8;
  char cVar9;
  int iVar10;
  uint uVar11;
  xmlPatternPtr comp;
  xmlPatParserContextPtr ctxt;
  _xmlPattern *ctxt_00;
  xmlStepOpPtr pxVar12;
  byte *pbVar13;
  xmlStreamCompPtr pxVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  xmlChar **ppxVar18;
  xmlChar *pxVar19;
  xmlChar **ppxVar20;
  long lVar21;
  ulong uVar22;
  xmlChar *pxVar23;
  ulong uVar24;
  long lVar25;
  uint flags_00;
  xmlChar *in_R8;
  bool bVar26;
  uint local_6c;
  xmlChar *local_60;
  
  if (pattern == (xmlChar *)0x0) {
LAB_0016d3f7:
    comp = (xmlPatternPtr)0x0;
  }
  else {
    if (*pattern != '\0') {
      uVar15 = flags | 0x200;
      bVar26 = true;
      local_6c = 0;
      comp = (xmlPatternPtr)0x0;
LAB_0016c92d:
      for (lVar21 = 0; pattern[lVar21] != '\0'; lVar21 = lVar21 + 1) {
        if (pattern[lVar21] == '|') {
          local_60 = xmlStrndup(pattern,(int)lVar21);
          if (local_60 == (xmlChar *)0x0) {
            ctxt = (xmlPatParserContextPtr)0x0;
          }
          else {
            ctxt = xmlNewPatParserContext(local_60,dict,namespaces);
          }
          lVar21 = lVar21 + 1;
          goto LAB_0016c99e;
        }
      }
      ctxt = xmlNewPatParserContext(pattern,dict,namespaces);
      local_60 = (xmlChar *)0x0;
LAB_0016c99e:
      pattern = pattern + lVar21;
      if (ctxt == (xmlPatParserContextPtr)0x0) goto LAB_0016d3ac;
      ctxt_00 = (_xmlPattern *)(*xmlMalloc)(0x40);
      if (ctxt_00 == (_xmlPattern *)0x0) {
LAB_0016c9f5:
        ctxt_00 = (_xmlPattern *)0x0;
      }
      else {
        ctxt_00->flags = 0;
        ctxt_00->nbStep = 0;
        ctxt_00->maxStep = 0;
        *(undefined4 *)&ctxt_00->field_0x2c = 0;
        ctxt_00->steps = (xmlStepOpPtr)0x0;
        ctxt_00->stream = (xmlStreamCompPtr)0x0;
        ctxt_00->next = (_xmlPattern *)0x0;
        ctxt_00->pattern = (xmlChar *)0x0;
        ctxt_00->data = (void *)0x0;
        ctxt_00->dict = (xmlDictPtr)0x0;
        ctxt_00->maxStep = 10;
        pxVar12 = (xmlStepOpPtr)(*xmlMalloc)(0xf0);
        ctxt_00->steps = pxVar12;
        if (pxVar12 == (xmlStepOpPtr)0x0) {
          (*xmlFree)(ctxt_00);
          goto LAB_0016c9f5;
        }
      }
      if (ctxt_00 != (_xmlPattern *)0x0) {
        if (dict != (xmlDict *)0x0) {
          ctxt_00->dict = dict;
          xmlDictReference(dict);
        }
        p_Var8 = ctxt_00;
        if (comp != (xmlPatternPtr)0x0) {
          ctxt_00->next = comp->next;
          comp->next = ctxt_00;
          p_Var8 = comp;
        }
        comp = p_Var8;
        ctxt_00->flags = flags;
        ctxt->comp = ctxt_00;
        pbVar13 = ctxt->cur;
        pbVar17 = pbVar13;
        if ((flags & 6U) != 0) {
          while( true ) {
            pbVar17 = pbVar17 + 1;
            uVar24 = (ulong)*pbVar13;
            if (0x2f < uVar24) break;
            if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
              if (uVar24 == 0x2f) goto LAB_0016ce04;
              break;
            }
            pbVar13 = pbVar13 + 1;
            ctxt->cur = pbVar13;
          }
          ctxt_00->flags = uVar15;
          if (*pbVar13 != 0x2e) goto LAB_0016cc8d;
          while( true ) {
            ctxt->cur = pbVar17;
            uVar24 = (ulong)*pbVar17;
            if (0x2f < uVar24) break;
            if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
              if (uVar24 == 0) {
                iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000002,
                                       XML_OP_END,(xmlChar *)0x0,in_R8);
                if (iVar10 == 0) goto LAB_0016ce0a;
              }
              else if (uVar24 == 0x2f) goto LAB_0016caf1;
              break;
            }
            pbVar17 = pbVar17 + 1;
          }
          goto LAB_0016ce04;
        }
        while( true ) {
          pbVar17 = pbVar13 + 1;
          uVar24 = (ulong)*pbVar13;
          if (0x2f < uVar24) break;
          if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
            uVar16 = uVar15;
            if ((uVar24 == 0x2e) || (uVar16 = flags | 0x100, uVar24 == 0x2f)) goto LAB_0016cb7b;
            break;
          }
          ctxt->cur = pbVar17;
          pbVar13 = pbVar17;
        }
        uVar16 = uVar15;
        if ((flags & 1U) != 0) {
LAB_0016cb7b:
          ctxt_00->flags = uVar16;
        }
        if (*pbVar13 == 0x2e) {
          if ((*pbVar17 == 0x2f) && (pbVar13[2] == 0x2f)) {
            iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                                   XML_OP_END,(xmlChar *)0x0,in_R8);
            if (iVar10 != 0) goto LAB_0016ce0a;
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            pbVar13 = ctxt->cur;
            while( true ) {
              uVar24 = (ulong)*pbVar13;
              if (0x20 < uVar24) break;
              if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                if (uVar24 == 0) goto LAB_0016ce04;
                break;
              }
              ctxt->cur = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
            }
          }
LAB_0016cd51:
          xVar1 = *ctxt->cur;
          if (xVar1 == '/') {
            iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000001,
                                   XML_OP_END,(xmlChar *)0x0,in_R8);
            if (iVar10 == 0) {
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              pbVar13 = ctxt->cur;
              while( true ) {
                uVar24 = (ulong)*pbVar13;
                if (0x20 < uVar24) break;
                if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                  if (uVar24 == 0) goto LAB_0016ce04;
                  break;
                }
                ctxt->cur = pbVar13 + 1;
                pbVar13 = pbVar13 + 1;
              }
              goto LAB_0016d09b;
            }
          }
          else if (xVar1 == '@') {
            ctxt->cur = ctxt->cur + 1;
            xmlCompileAttributeTest(ctxt);
            pbVar13 = ctxt->cur;
            while( true ) {
              uVar24 = (ulong)*pbVar13;
              if (0x20 < uVar24) break;
              if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                if (uVar24 == 0) goto LAB_0016cdec;
                break;
              }
              ctxt->cur = pbVar13 + 1;
              pbVar13 = pbVar13 + 1;
            }
            xmlCompileStepPattern(ctxt);
            if (ctxt->error == 0) {
LAB_0016cdec:
              if (*ctxt->cur != '\0') goto LAB_0016ce04;
            }
          }
          else {
LAB_0016d09b:
            xmlCompileStepPattern(ctxt);
            if (ctxt->error == 0) {
              pbVar13 = ctxt->cur;
              while( true ) {
                if ((0x20 < (ulong)*pbVar13) ||
                   ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
                ctxt->cur = pbVar13 + 1;
                pbVar13 = pbVar13 + 1;
              }
              do {
                if (*ctxt->cur != '/') goto LAB_0016cdec;
                if (ctxt->cur[1] == '/') {
                  iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,
                                         (xmlPatternPtr)&DAT_00000006,XML_OP_END,(xmlChar *)0x0,
                                         in_R8);
                  if (iVar10 != 0) break;
                  if (*ctxt->cur != '\0') {
                    ctxt->cur = ctxt->cur + 1;
                  }
                  if (*ctxt->cur != '\0') {
                    ctxt->cur = ctxt->cur + 1;
                  }
                  pbVar13 = ctxt->cur;
                  while( true ) {
                    if ((0x20 < (ulong)*pbVar13) ||
                       ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
                    ctxt->cur = pbVar13 + 1;
                    pbVar13 = pbVar13 + 1;
                  }
                }
                else {
                  iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,
                                         (xmlPatternPtr)&DAT_00000005,XML_OP_END,(xmlChar *)0x0,
                                         in_R8);
                  if (iVar10 != 0) break;
                  if (*ctxt->cur != '\0') {
                    ctxt->cur = ctxt->cur + 1;
                  }
                  pbVar13 = ctxt->cur;
                  while( true ) {
                    uVar24 = (ulong)*pbVar13;
                    if (0x20 < uVar24) break;
                    if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                      if (uVar24 == 0) goto LAB_0016ce04;
                      break;
                    }
                    ctxt->cur = pbVar13 + 1;
                    pbVar13 = pbVar13 + 1;
                  }
                }
                xmlCompileStepPattern(ctxt);
              } while (ctxt->error == 0);
            }
          }
        }
        else {
          if ((*pbVar13 != 0x2f) || (*pbVar17 != 0x2f)) goto LAB_0016cd51;
          iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                                 XML_OP_END,(xmlChar *)0x0,in_R8);
          if (iVar10 == 0) {
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            goto LAB_0016cd51;
          }
        }
        goto LAB_0016ce0a;
      }
      goto LAB_0016d3ae;
    }
    bVar26 = true;
    comp = (xmlPatternPtr)0x0;
LAB_0016d364:
    pxVar7 = comp;
    if (!bVar26) {
      for (; pxVar7 != (xmlPatternPtr)0x0; pxVar7 = pxVar7->next) {
        if (pxVar7->stream != (xmlStreamCompPtr)0x0) {
          xmlFreeStreamComp(pxVar7->stream);
          pxVar7->stream = (xmlStreamCompPtr)0x0;
        }
      }
    }
  }
  return comp;
  while ((0x100002600U >> (uVar24 & 0x3f) & 1) != 0) {
LAB_0016caf1:
    pbVar13 = pbVar17;
    pbVar17 = pbVar13 + 1;
    ctxt->cur = pbVar17;
    uVar24 = (ulong)*pbVar17;
    if (0x2f < uVar24) goto LAB_0016cc80;
  }
  if (uVar24 == 0x2f) {
    uVar24 = (ulong)*pbVar13;
    if (((0x20 < uVar24) || ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0)) &&
       (iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt_00,(xmlPatternPtr)&DAT_00000006,
                               XML_OP_END,(xmlChar *)0x0,in_R8), iVar10 == 0)) {
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar13 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar13 + 1;
        pbVar13 = pbVar13 + 1;
      }
      goto LAB_0016cc80;
    }
  }
  else {
LAB_0016cc80:
    if (*ctxt->cur != '\0') {
LAB_0016cc8d:
      xmlCompileStepPattern(ctxt);
      if (ctxt->error == 0) {
        while( true ) {
          pbVar13 = ctxt->cur;
          while( true ) {
            uVar24 = (ulong)*pbVar13;
            if (0x2f < uVar24) goto LAB_0016ce04;
            if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) break;
            ctxt->cur = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
          }
          if (uVar24 == 0) goto LAB_0016ce0a;
          if ((uVar24 != 0x2f) ||
             (iVar10 = xmlPatternAdd((xmlPatParserContextPtr)ctxt->comp,(xmlPatternPtr)&DAT_00000005
                                     ,XML_OP_END,(xmlChar *)0x0,in_R8), iVar10 != 0)) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          pbVar13 = ctxt->cur;
          while( true ) {
            uVar24 = (ulong)*pbVar13;
            if (0x2f < uVar24) break;
            if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
              if ((uVar24 == 0) || (uVar24 == 0x2f)) goto LAB_0016ce04;
              break;
            }
            ctxt->cur = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
          }
          xmlCompileStepPattern(ctxt);
          if (ctxt->error != 0) break;
        }
      }
    }
  }
LAB_0016ce04:
  ctxt->error = 1;
LAB_0016ce0a:
  if (ctxt->error == 0) {
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
    if (bVar26) {
      if (local_6c == 0x200) {
        uVar16 = ctxt_00->flags & 0x100;
        cVar9 = (char)(uVar16 >> 8);
        bVar26 = uVar16 == 0;
        local_6c = 0x200;
      }
      else if (local_6c == 0x100) {
        uVar16 = ctxt_00->flags & 0x200;
        cVar9 = (char)(uVar16 >> 9);
        bVar26 = uVar16 == 0;
        local_6c = 0x100;
      }
      else {
        bVar26 = true;
        if (local_6c == 0) {
          local_6c = ctxt_00->flags & 0x300;
        }
        cVar9 = '\0';
      }
    }
    else {
      cVar9 = '\x01';
      bVar26 = false;
    }
    if ((cVar9 == '\0') && (pxVar12 = ctxt_00->steps, pxVar12 != (xmlStepOpPtr)0x0)) {
      if ((ctxt_00->nbStep == 1) &&
         (((pxVar12->op == XML_OP_ELEM && (pxVar12->value == (xmlChar *)0x0)) &&
          (pxVar12->value2 == (xmlChar *)0x0)))) {
        pxVar14 = xmlNewStreamComp(0);
        if (pxVar14 != (xmlStreamCompPtr)0x0) {
          pbVar13 = (byte *)((long)&pxVar14->flags + 1);
          *pbVar13 = *pbVar13 | 0x40;
          ctxt_00->stream = pxVar14;
        }
      }
      else {
        pxVar14 = xmlNewStreamComp(ctxt_00->nbStep / 2 + 1);
        if (pxVar14 != (xmlStreamCompPtr)0x0) {
          dict_00 = ctxt_00->dict;
          if (dict_00 != (xmlDictPtr)0x0) {
            pxVar14->dict = dict_00;
            xmlDictReference(dict_00);
          }
          if ((ctxt_00->flags & 0x100) != 0) {
            pbVar13 = (byte *)((long)&pxVar14->flags + 1);
            *pbVar13 = *pbVar13 | 0x80;
          }
          uVar24 = (ulong)(uint)ctxt_00->nbStep;
          if (ctxt_00->nbStep < 1) {
            uVar16 = 0;
            bVar5 = true;
          }
          else {
            uVar11 = 0xffffffff;
            lVar21 = 0;
            uVar16 = 0;
            in_R8 = (xmlChar *)0x0;
            bVar5 = false;
            uVar22 = 1;
            do {
              pxVar12 = ctxt_00->steps;
              iVar10 = *(int *)((long)&pxVar12->op + lVar21);
              if (7 < iVar10 - 1U) goto switchD_0016cf82_caseD_5;
              pxVar23 = *(xmlChar **)((long)&pxVar12->value + lVar21);
              pxVar19 = *(xmlChar **)((long)&pxVar12->value2 + lVar21);
              flags_00 = (uint)in_R8;
              switch(iVar10) {
              case 1:
                bVar5 = true;
                if (lVar21 != 0) goto LAB_0016d1d9;
                break;
              case 2:
                if (pxVar23 != (xmlChar *)0x0 || pxVar19 != (xmlChar *)0x0)
                goto switchD_0016cf82_caseD_3;
                if (in_R8 != (xmlChar *)0x0 && uVar22 == (uVar24 & 0xffffffff)) {
                  pbVar13 = (byte *)((long)&pxVar14->flags + 1);
                  *pbVar13 = *pbVar13 | 0x40;
                  in_R8 = (xmlChar *)(ulong)(flags_00 | 0x10);
                  uVar16 = xmlStreamCompAddStep
                                     (pxVar14,(xmlChar *)0x0,(xmlChar *)0x0,100,flags_00 | 0x10);
                  if ((int)uVar16 < 0) goto LAB_0016d1d9;
                  in_R8 = (xmlChar *)0x0;
                  if (uVar11 != 0xffffffff) {
                    pxVar14->steps[uVar11].flags = pxVar14->steps[uVar11].flags | 0x20;
                  }
                  uVar11 = 0xffffffff;
                }
                break;
              case 3:
switchD_0016cf82_caseD_3:
                goto LAB_0016d018;
              case 4:
                in_R8 = (xmlChar *)(ulong)(flags_00 | 8);
                uVar16 = xmlStreamCompAddStep(pxVar14,pxVar23,pxVar19,2,flags_00 | 8);
                if (-1 < (int)uVar16) {
                  uVar11 = 0xffffffff;
                  goto LAB_0016d059;
                }
                goto LAB_0016d1d9;
              case 6:
                if (in_R8 == (xmlChar *)0x0) {
                  in_R8 = &DAT_00000001;
                  if (((uint)pxVar14->flags >> 0x10 & 1) == 0) {
                    pxVar14->flags = pxVar14->flags | 0x10000;
                  }
                }
                break;
              case 7:
                pxVar19 = pxVar23;
                pxVar23 = (xmlChar *)0x0;
                goto LAB_0016d018;
              case 8:
                pxVar19 = (xmlChar *)0x0;
                pxVar23 = (xmlChar *)0x0;
LAB_0016d018:
                uVar11 = xmlStreamCompAddStep(pxVar14,pxVar23,pxVar19,1,flags_00);
                uVar16 = uVar11;
                if ((int)uVar11 < 0) goto LAB_0016d1d9;
LAB_0016d059:
                in_R8 = (xmlChar *)0x0;
              }
switchD_0016cf82_caseD_5:
              uVar24 = (ulong)ctxt_00->nbStep;
              lVar21 = lVar21 + 0x18;
              bVar4 = (long)uVar22 < (long)uVar24;
              uVar22 = uVar22 + 1;
            } while (bVar4);
            bVar5 = !bVar5;
          }
          if ((bVar5) && ((ctxt_00->flags & 7) == 0)) {
            if (((uint)pxVar14->flags >> 0x10 & 1) == 0) {
              pxVar14->flags = pxVar14->flags | 0x10000;
            }
            if (0 < pxVar14->nbStep) {
              uVar11 = pxVar14->steps->flags;
              if ((uVar11 & 1) == 0) {
                pxVar14->steps->flags = uVar11 | 1;
              }
            }
          }
          if ((int)uVar16 < pxVar14->nbStep) {
            pxVar3 = pxVar14->steps;
            pxVar3[uVar16].flags = pxVar3[uVar16].flags | 2;
            if (!bVar5) {
              *(byte *)&pxVar3->flags = (byte)pxVar3->flags | 4;
            }
            ctxt_00->stream = pxVar14;
          }
          else {
LAB_0016d1d9:
            xmlFreeStreamComp(pxVar14);
          }
        }
      }
    }
    iVar10 = ctxt_00->nbStep;
    if ((0 < iVar10) && (ctxt_00->steps->op == XML_OP_ANCESTOR)) {
      if (iVar10 != 1) {
        uVar24 = (ulong)(iVar10 - 1);
        ppxVar18 = &ctxt_00->steps[1].value2;
        do {
          ppxVar18[-4] = ppxVar18[-1];
          ppxVar18[-3] = *ppxVar18;
          *(xmlPatOp *)(ppxVar18 + -5) = ((xmlStepOp *)(ppxVar18 + -2))->op;
          ppxVar18 = ppxVar18 + 3;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      ctxt_00->nbStep = iVar10 + -1;
    }
    if (ctxt_00->maxStep <= ctxt_00->nbStep) {
      pxVar12 = (xmlStepOpPtr)(*xmlRealloc)(ctxt_00->steps,(long)ctxt_00->maxStep * 0x30);
      if (pxVar12 == (xmlStepOpPtr)0x0) {
LAB_0016d3ac:
        ctxt = (xmlPatParserContextPtr)0x0;
        goto LAB_0016d3ae;
      }
      ctxt_00->steps = pxVar12;
      ctxt_00->maxStep = ctxt_00->maxStep << 1;
    }
    iVar10 = ctxt_00->nbStep;
    lVar21 = (long)iVar10;
    if (1 < lVar21) {
      ppxVar20 = &ctxt_00->steps[lVar21 + -1].value2;
      ppxVar18 = &ctxt_00->steps->value2;
      lVar25 = 0;
      pxVar23 = (xmlChar *)(lVar21 + -2);
      do {
        pxVar19 = ppxVar18[-1];
        ppxVar18[-1] = ppxVar20[-1];
        ppxVar20[-1] = pxVar19;
        pxVar19 = *ppxVar18;
        *ppxVar18 = *ppxVar20;
        *ppxVar20 = pxVar19;
        xVar2 = ((xmlStepOp *)(ppxVar18 + -2))->op;
        ((xmlStepOp *)(ppxVar18 + -2))->op = ((xmlStepOp *)(ppxVar20 + -2))->op;
        ((xmlStepOp *)(ppxVar20 + -2))->op = xVar2;
        lVar25 = lVar25 + 1;
        ppxVar18 = ppxVar18 + 3;
        in_R8 = pxVar23 + -1;
        ppxVar20 = ppxVar20 + -3;
        bVar5 = lVar25 < (long)pxVar23;
        pxVar23 = in_R8;
      } while (bVar5);
    }
    pxVar12 = ctxt_00->steps;
    pxVar6 = pxVar12 + lVar21;
    pxVar6->value = (xmlChar *)0x0;
    pxVar6->value2 = (xmlChar *)0x0;
    ctxt_00->nbStep = iVar10 + 1;
    pxVar12[lVar21].op = XML_OP_END;
    if (local_60 != (xmlChar *)0x0) {
      (*xmlFree)(local_60);
    }
    if (*pattern == '\0') goto LAB_0016d364;
    goto LAB_0016c92d;
  }
LAB_0016d3ae:
  if (ctxt != (xmlPatParserContextPtr)0x0) {
    *(undefined4 *)&ctxt->namespaces = 0xffffffff;
    *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
    ctxt->nb_namespaces = -1;
    *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
    *(undefined4 *)&ctxt->comp = 0xffffffff;
    *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->elem = 0xffffffff;
    *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
    ctxt->error = -1;
    *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
    *(undefined4 *)&ctxt->dict = 0xffffffff;
    *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->cur = 0xffffffff;
    *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
    *(undefined4 *)&ctxt->base = 0xffffffff;
    *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
    (*xmlFree)(ctxt);
  }
  if (comp != (xmlPatternPtr)0x0) {
    xmlFreePatternList(comp);
  }
  if (local_60 != (xmlChar *)0x0) {
    (*xmlFree)(local_60);
  }
  goto LAB_0016d3f7;
}

Assistant:

xmlPatternPtr
xmlPatterncompile(const xmlChar *pattern, xmlDict *dict, int flags,
                  const xmlChar **namespaces) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;

    if (pattern == NULL)
        return(NULL);

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) goto error;
	cur = xmlNewPattern();
	if (cur == NULL) goto error;
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0)
	    goto error;
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable)
	    xmlStreamCompile(cur);
	if (xmlReversePattern(cur) < 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    return(ret);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    return(NULL);
}